

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          ::dx((FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>::val
                    ((FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_> *
                     )0x1ec86e7);
  vVar3 = FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>::dx
                    (in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          ::val((FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                 *)0x1ec8712);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}